

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_info.cpp
# Opt level: O2

string * __thiscall
duckdb::LoadInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,LoadInfo *this)

{
  LoadType value;
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator local_c1;
  string local_c0;
  string local_a0;
  string local_80 [32];
  string local_60;
  string local_40 [32];
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b6586a + 9,(allocator *)&local_c0);
  value = this->load_type;
  if (value == FORCE_INSTALL) {
    ::std::__cxx11::string::string(local_80,"FORCE INSTALL",(allocator *)&local_c0);
  }
  else if (value == INSTALL) {
    ::std::__cxx11::string::string(local_80,"INSTALL",(allocator *)&local_c0);
  }
  else {
    if (value != LOAD) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_c0,"ToString for LoadType with type: %s not implemented",&local_c1
                );
      EnumUtil::ToString<duckdb::LoadType>(&local_a0,value);
      InternalException::InternalException<std::__cxx11::string>(this_00,&local_c0,&local_a0);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string(local_80,"LOAD",(allocator *)&local_c0);
  }
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::string(local_40," \'%s\'",(allocator *)&local_a0);
  ::std::__cxx11::string::string((string *)&local_60,(string *)&this->filename);
  StringUtil::Format<std::__cxx11::string>(&local_c0,(StringUtil *)local_40,&local_60,in_RCX);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string(local_40);
  if ((this->repository)._M_string_length != 0) {
    if (this->repo_is_alias == true) {
      KeywordHelper::WriteOptionallyQuoted(&local_a0,&this->repository,'\"',true);
      ::std::operator+(&local_c0," FROM ",&local_a0);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      KeywordHelper::WriteQuoted(&local_a0,&this->repository,'\'');
      ::std::operator+(&local_c0," FROM ",&local_a0);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string LoadInfo::ToString() const {
	string result = "";
	result += LoadInfoToString(load_type);
	result += StringUtil::Format(" '%s'", filename);
	if (!repository.empty()) {
		if (repo_is_alias) {
			result += " FROM " + KeywordHelper::WriteOptionallyQuoted(repository);
		} else {
			result += " FROM " + KeywordHelper::WriteQuoted(repository);
		}
	}

	result += ";";
	return result;
}